

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcSat.c
# Opt level: O2

int Abc_NtkClauseTop(sat_solver *pSat,Vec_Ptr_t *vNodes,Vec_Int_t *vVars)

{
  void *pvVar1;
  int iVar2;
  
  vVars->nSize = 0;
  for (iVar2 = 0; iVar2 < vNodes->nSize; iVar2 = iVar2 + 1) {
    pvVar1 = Vec_PtrEntry(vNodes,iVar2);
    Vec_IntPush(vVars,((uint)pvVar1 & 1) + *(int *)(((ulong)pvVar1 & 0xfffffffffffffffe) + 0x40) * 2
               );
  }
  iVar2 = sat_solver_addclause(pSat,vVars->pArray,vVars->pArray + vVars->nSize);
  return iVar2;
}

Assistant:

int Abc_NtkClauseTop( sat_solver * pSat, Vec_Ptr_t * vNodes, Vec_Int_t * vVars )
{
    Abc_Obj_t * pNode;
    int i;
//printf( "Adding triv %d.         %d\n", Abc_ObjRegular(pNode)->Id, (int)pSat->sat_solver_stats.clauses );
    vVars->nSize = 0;
    Vec_PtrForEachEntry( Abc_Obj_t *, vNodes, pNode, i )
        Vec_IntPush( vVars, toLitCond( (int)(ABC_PTRINT_T)Abc_ObjRegular(pNode)->pCopy, Abc_ObjIsComplement(pNode) ) );
//    Vec_IntPush( vVars, toLitCond( (int)Abc_ObjRegular(pNode)->Id, Abc_ObjIsComplement(pNode) ) );
    return sat_solver_addclause( pSat, vVars->pArray, vVars->pArray + vVars->nSize );
}